

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O2

bool __thiscall Clasp::SatBuilder::doEndProgram(SatBuilder *this)

{
  byte bVar1;
  byte bVar2;
  uint32 uVar3;
  Share SVar4;
  SharedContext *pSVar5;
  pointer pVVar6;
  bool bVar7;
  Literal LVar8;
  Var v;
  uint v_00;
  pointer pLVar9;
  pointer pLVar10;
  Result RVar11;
  ConstraintInfo local_5c;
  LitVec cc;
  Literal relax;
  undefined4 uStack_3c;
  
  bVar7 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  if ((bVar7) && ((this->softClauses_).ebo_.size != 0)) {
    SharedContext::setPreserveModels((this->super_ProgramBuilder).ctx_,true);
    pSVar5 = (this->super_ProgramBuilder).ctx_;
    SharedContext::addVars(pSVar5,(this->vars_ - (pSVar5->varInfo_).ebo_.size) + 1,Atom,' ');
    SharedContext::startAddConstraints((this->super_ProgramBuilder).ctx_,100);
    cc.ebo_.buf = (pointer)0x0;
    cc.ebo_.size = 0;
    cc.ebo_.cap = 0;
    pLVar10 = (this->softClauses_).ebo_.buf;
    pLVar9 = pLVar10 + (this->softClauses_).ebo_.size;
    bVar7 = true;
    while ((pLVar10 != pLVar9 && (bVar7))) {
      uVar3 = pLVar10->rep_;
      LVar8.rep_ = pLVar10[1].rep_;
      bVar7 = true;
      if ((LVar8.rep_ & 1) == 0) {
        relax.rep_ = LVar8.rep_;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::assign(&cc,1,&relax);
        do {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (&cc,pLVar10 + 2);
          pLVar10 = pLVar10 + 1;
        } while ((cc.ebo_.buf[cc.ebo_.size - 1].rep_ & 1) == 0);
        cc.ebo_.buf[cc.ebo_.size - 1].rep_ = cc.ebo_.buf[cc.ebo_.size - 1].rep_ & 0xfffffffe;
        local_5c.super_ConstraintScore.rep = (ConstraintScore)0;
        RVar11 = ClauseCreator::create
                           (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,&cc,0,
                            &local_5c);
        bVar7 = ((undefined1  [16])RVar11 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
        LVar8 = relax;
      }
      _relax = (pointer)(CONCAT44(uStack_3c,LVar8.rep_) & 0xfffffffffffffffe);
      ProgramBuilder::addMinLit
                (&this->super_ProgramBuilder,0,
                 (WeightLiteral)(CONCAT44(uVar3,LVar8.rep_) & 0xfffffffffffffffe));
      pLVar10 = pLVar10 + 2;
    }
    _relax = (this->softClauses_).ebo_.buf;
    (this->softClauses_).ebo_.buf = (pointer)0x0;
    (this->softClauses_).ebo_.size = 0;
    (this->softClauses_).ebo_.cap = 0;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo((ebo *)&relax);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&cc.ebo_);
    if (bVar7) {
LAB_00157304:
      SVar4 = ((this->super_ProgramBuilder).ctx_)->share_;
      for (v_00 = 1; v_00 != (this->varState_).ebo_.size; v_00 = v_00 + 1) {
        bVar1 = (this->varState_).ebo_.buf[v_00];
        if ((~bVar1 & 0xc) != 0) {
          if (bVar1 == 0) {
            if (((uint)SVar4 >> 0x1b & 1) == 0) {
              SharedContext::eliminate((this->super_ProgramBuilder).ctx_,v_00);
            }
          }
          else {
            pSVar5 = (this->super_ProgramBuilder).ctx_;
            pVVar6 = (pSVar5->varInfo_).ebo_.buf;
            bVar2 = pVVar6[v_00].rep;
            if ((bVar2 & 0x20) != 0) {
              pVVar6[v_00].rep = bVar2 & 0xdf;
            }
            Solver::setPref(*(pSVar5->solvers_).ebo_.buf,v_00,def_value,bVar1 >> 2);
          }
        }
      }
      ProgramBuilder::markOutputVariables(&this->super_ProgramBuilder);
      return true;
    }
  }
  else if (bVar7) goto LAB_00157304;
  return false;
}

Assistant:

bool SatBuilder::doEndProgram() {
	bool ok = ctx()->ok();
	if (!softClauses_.empty() && ok) {
		ctx()->setPreserveModels(true);
		uint32 softVars = vars_ - ctx()->numVars();
		ctx()->addVars(softVars, Var_t::Atom, VarInfo::Nant);
		ctx()->startAddConstraints();
		LitVec cc;
		for (LitVec::const_iterator it = softClauses_.begin(), end = softClauses_.end(); it != end && ok; ++it) {
			weight_t w     = (weight_t)it->rep();
			Literal  relax = *++it;
			if (!relax.flagged()) {
				cc.assign(1, relax);
				do { cc.push_back(*++it); } while (!cc.back().flagged());
				cc.back().unflag();
				ok = ClauseCreator::create(*ctx()->master(), cc, Constraint_t::Static).ok();
			}
			addMinLit(0, WeightLiteral(relax.unflag(), w));
		}
		LitVec().swap(softClauses_);
	}
	if (ok) {
		const uint32 seen = 12;
		const bool   elim = !ctx()->preserveModels();
		for (Var v = 1; v != (Var)varState_.size() && ok; ++v) {
			uint32 m = varState_[v];
			if ( (m & seen) != seen ) {
				if      (m)   { ctx()->setNant(v, false); ctx()->master()->setPref(v, ValueSet::def_value, ValueRep(m >> 2)); }
				else if (elim){ ctx()->eliminate(v); }
			}
		}
		markOutputVariables();
	}
	return ok;
}